

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputBlockMemberTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBCaptureInactiveOutputBlockMemberTest *this,
          GLuint test_case_index)

{
  char *__s;
  TestError *this_00;
  allocator<char> local_35 [13];
  char *local_28;
  GLchar *name;
  XFBCaptureInactiveOutputBlockMemberTest *pXStack_18;
  GLuint test_case_index_local;
  XFBCaptureInactiveOutputBlockMemberTest *this_local;
  
  local_28 = (char *)0x0;
  name._4_4_ = test_case_index;
  pXStack_18 = this;
  this_local = (XFBCaptureInactiveOutputBlockMemberTest *)__return_storage_ptr__;
  if (test_case_index == 0) {
    local_28 = "vertex";
  }
  else if (test_case_index == 1) {
    local_28 = "tesselation evaluation";
  }
  else {
    if (test_case_index != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x68e3);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_28 = "geometry";
  }
  __s = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,local_35);
  std::allocator<char>::~allocator(local_35);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBCaptureInactiveOutputBlockMemberTest::getTestCaseName(glw::GLuint test_case_index)
{
	const GLchar* name = 0;

	switch (test_case_index)
	{
	case TEST_VS:
		name = "vertex";
		break;
	case TEST_TES:
		name = "tesselation evaluation";
		break;
	case TEST_GS:
		name = "geometry";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return name;
}